

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O3

leveldb_filterpolicy_t *
leveldb_filterpolicy_create
          (void *state,_func_void_void_ptr *destructor,
          _func_char_ptr_void_ptr_char_ptr_ptr_size_t_ptr_int_size_t_ptr *create_filter,
          _func_uchar_void_ptr_char_ptr_size_t_char_ptr_size_t *key_may_match,
          _func_char_ptr_void_ptr *name)

{
  leveldb_filterpolicy_t *plVar1;
  
  plVar1 = (leveldb_filterpolicy_t *)operator_new(0x30);
  (plVar1->super_FilterPolicy)._vptr_FilterPolicy =
       (_func_int **)&PTR__leveldb_filterpolicy_t_0013bdd0;
  plVar1->state_ = state;
  plVar1->destructor_ = destructor;
  plVar1->create_ = create_filter;
  plVar1->key_match_ = key_may_match;
  plVar1->name_ = name;
  return plVar1;
}

Assistant:

leveldb_filterpolicy_t* leveldb_filterpolicy_create(
    void* state, void (*destructor)(void*),
    char* (*create_filter)(void*, const char* const* key_array,
                           const size_t* key_length_array, int num_keys,
                           size_t* filter_length),
    unsigned char (*key_may_match)(void*, const char* key, size_t length,
                                   const char* filter, size_t filter_length),
    const char* (*name)(void*)) {
  leveldb_filterpolicy_t* result = new leveldb_filterpolicy_t;
  result->state_ = state;
  result->destructor_ = destructor;
  result->create_ = create_filter;
  result->key_match_ = key_may_match;
  result->name_ = name;
  return result;
}